

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O2

int __thiscall
ut11::detail::DeclareFixtureObj<IsNotStringContainingSubstringTests>::operator()<>
          (DeclareFixtureObj<IsNotStringContainingSubstringTests> *this,Category *category)

{
  tuple<IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
  this_00;
  __uniq_ptr_impl<IsNotStringContainingSubstringTests,_std::default_delete<IsNotStringContainingSubstringTests>_>
  local_b0;
  shared_ptr<ut11::detail::TestFixtureAbstract> local_a8;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00.
  super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
  .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
        )operator_new(0x60);
  *(undefined8 *)
   this_00.
   super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
   .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl = 0;
  (((string *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 8))->
  _M_dataplus)._M_p = (pointer)0x0;
  *(size_type *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x10)
       = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)this_00.
             super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
             .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl +
      0x18))->_M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x20)
       = 0;
  (((unique_ptr<ut11::detail::TestStageBuilder,_std::default_delete<ut11::detail::TestStageBuilder>_>
     *)((long)this_00.
              super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
              .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl +
       0x28))->_M_t).
  super___uniq_ptr_impl<ut11::detail::TestStageBuilder,_std::default_delete<ut11::detail::TestStageBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_ut11::detail::TestStageBuilder_*,_std::default_delete<ut11::detail::TestStageBuilder>_>
  .super__Head_base<0UL,_ut11::detail::TestStageBuilder_*,_false>._M_head_impl =
       (TestStageBuilder *)0x0;
  *(undefined8 *)
   &(((set<ut11::Category,_std::less<ut11::Category>,_std::allocator<ut11::Category>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
            .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x30
     ))->_M_t)._M_impl = 0;
  *(undefined8 *)
   &((_Rb_tree_header *)
    ((long)this_00.
           super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
           .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x38)
    )->_M_header = 0;
  *(_Base_ptr *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x40)
       = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x48)
       = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x50)
       = (_Base_ptr)0x0;
  *(size_t *)
   ((long)this_00.
          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl + 0x58)
       = 0;
  IsNotStringContainingSubstringTests::IsNotStringContainingSubstringTests
            ((IsNotStringContainingSubstringTests *)
             this_00.
             super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
             .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl);
  local_b0._M_t.
  super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
  .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl =
       (tuple<IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
        )(tuple<IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
          )this_00.
           super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
           .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl;
  std::operator+(&local_58,&this->m_name,"(");
  GetString_abi_cxx11_();
  std::operator+(&local_38,&local_58,&local_78);
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)this_00.
                    super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
                    .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>.
                    _M_head_impl + 8));
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string(local_98,(string *)category);
  (**(code **)(*(long *)this_00.
                        super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
                        .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>.
                        _M_head_impl + 0x10))
            (this_00.
             super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
             .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl,
             local_98);
  std::__cxx11::string::~string(local_98);
  std::__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<IsNotStringContainingSubstringTests,std::default_delete<IsNotStringContainingSubstringTests>,void>
            ((__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2> *)&local_a8
             ,(unique_ptr<IsNotStringContainingSubstringTests,_std::default_delete<IsNotStringContainingSubstringTests>_>
               *)&local_b0);
  PushFixture(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.
              super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if ((_Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
       )local_b0._M_t.
        super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
        .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>._M_head_impl !=
      (IsNotStringContainingSubstringTests *)0x0) {
    (**(code **)(*(long *)local_b0._M_t.
                          super__Tuple_impl<0UL,_IsNotStringContainingSubstringTests_*,_std::default_delete<IsNotStringContainingSubstringTests>_>
                          .super__Head_base<0UL,_IsNotStringContainingSubstringTests_*,_false>.
                          _M_head_impl + 8))();
  }
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}